

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  LogMessage *pLVar1;
  Reflection *reflection;
  TextGenerator generator;
  StringOutputStream output_stream;
  TextGenerator local_a0;
  FieldDescriptor *local_78;
  StringOutputStream local_70;
  LogMessage local_60;
  
  local_78 = field;
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x8a7);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: output: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"output specified is nullptr");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&local_70,output);
  local_a0.indent_level_ = this->initial_indent_level_;
  local_a0.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_004e4900;
  local_a0.buffer_ = (char *)0x0;
  local_a0.buffer_size_ = 0;
  local_a0.at_start_of_line_ = true;
  local_a0.failed_ = false;
  local_a0.insert_silent_marker_ = false;
  local_a0.output_ = &local_70.super_ZeroCopyOutputStream;
  local_a0.initial_indent_level_ = local_a0.indent_level_;
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  PrintFieldValue(this,message,reflection,local_78,index,&local_a0);
  local_a0.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_004e4900;
  if ((local_a0.failed_ == false) && (0 < local_a0.buffer_size_)) {
    (*((ZeroCopyOutputStream *)&(local_a0.output_)->_vptr_ZeroCopyOutputStream)->
      _vptr_ZeroCopyOutputStream[3])();
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}